

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_layout_reset_min_row_height(nk_context *ctx)

{
  float fVar1;
  float fVar2;
  nk_panel *pnVar3;
  
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (pnVar3 = ctx->current->layout, pnVar3 != (nk_panel *)0x0)) {
    fVar1 = (ctx->style).text.padding.y;
    fVar2 = (ctx->style).window.min_row_height_padding;
    (pnVar3->row).min_height = fVar2 + fVar2 + fVar1 + fVar1 + ((ctx->style).font)->height;
  }
  return;
}

Assistant:

NK_API void
nk_layout_reset_min_row_height(struct nk_context *ctx)
{
struct nk_window *win;
struct nk_panel *layout;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
layout->row.min_height = ctx->style.font->height;
layout->row.min_height += ctx->style.text.padding.y*2;
layout->row.min_height += ctx->style.window.min_row_height_padding*2;
}